

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

void Cnf_CollectLeaves_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper,int fStopCompl)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_38;
  int fStopCompl_local;
  Vec_Ptr_t *vSuper_local;
  Aig_Obj_t *pObj_local;
  Aig_Obj_t *pRoot_local;
  
  if ((pRoot == pObj) ||
     (((*(ulong *)&pObj->field_0x18 >> 4 & 1) == 0 &&
      ((fStopCompl == 0 || (iVar1 = Aig_IsComplement(pObj), iVar1 == 0)))))) {
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0x34,"void Cnf_CollectLeaves_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
    }
    if (fStopCompl == 0) {
      pAVar2 = Aig_ObjFanin0(pObj);
      Cnf_CollectLeaves_rec(pRoot,pAVar2,vSuper,0);
      pAVar2 = Aig_ObjFanin1(pObj);
      Cnf_CollectLeaves_rec(pRoot,pAVar2,vSuper,0);
    }
    else {
      pAVar2 = Aig_ObjChild0(pObj);
      Cnf_CollectLeaves_rec(pRoot,pAVar2,vSuper,1);
      pAVar2 = Aig_ObjChild1(pObj);
      Cnf_CollectLeaves_rec(pRoot,pAVar2,vSuper,1);
    }
  }
  else {
    local_38 = pObj;
    if (fStopCompl == 0) {
      local_38 = Aig_Regular(pObj);
    }
    Vec_PtrPushUnique(vSuper,local_38);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Detects multi-input gate rooted at this node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_CollectLeaves_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper, int fStopCompl )
{
    if ( pRoot != pObj && (pObj->fMarkA || (fStopCompl && Aig_IsComplement(pObj))) )
    {
        Vec_PtrPushUnique( vSuper, fStopCompl ? pObj : Aig_Regular(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( fStopCompl )
    {
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjChild0(pObj), vSuper, 1 );
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjChild1(pObj), vSuper, 1 );
    }
    else
    {
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjFanin0(pObj), vSuper, 0 );
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjFanin1(pObj), vSuper, 0 );
    }
}